

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::NewScObjectCommon
              (RecyclableObject *function,FunctionInfo *functionInfo,ScriptContext *requestContext,
              bool isBaseClassConstructorNewScObject)

{
  Type TVar1;
  ulong uVar2;
  code *pcVar3;
  ScriptContext *objectScriptContext;
  bool bVar4;
  int iVar5;
  LocalFunctionId LVar6;
  uint uVar7;
  JavascriptFunction *this;
  undefined4 *puVar8;
  RecyclableObject *pRVar9;
  FunctionProxy *this_00;
  ParseableFunctionInfo *this_01;
  FunctionBody *this_02;
  RecyclableObject *pRVar10;
  Var aValue;
  DynamicObject *pDVar11;
  DynamicTypeHandler *pDVar12;
  ConstructorCache *pCVar13;
  undefined4 extraout_var;
  char16 *pcVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char16_t *pcVar15;
  char16_t *pcVar16;
  char16_t *pcVar17;
  DynamicType *pDVar18;
  ScriptContext *pSVar19;
  bool local_b8 [8];
  bool cachedProtoCanBeCached;
  RecyclableObject *local_60;
  uint local_54;
  ScriptContext *local_50;
  ConstructorCache *local_48;
  ScriptContext *local_40;
  bool local_32;
  char local_31;
  bool prototypeCanBeCached;
  
  local_50 = requestContext;
  this = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
  if ((*(byte *)((long)&functionInfo->attributes + 1) >> 2 & !isBaseClassConstructorNewScObject) !=
      0) {
    return function;
  }
  local_48 = JavascriptFunction::GetConstructorCache(this);
  pSVar19 = (local_48->content).scriptContext.ptr;
  if ((pSVar19 != (ScriptContext *)0x0) &&
     (pSVar19 !=
      (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x196e,
                                "(constructorCache->GetScriptContext() == nullptr || constructorCache->GetScriptContext() == constructor->GetScriptContext())"
                                ,
                                "Why did we populate a constructor cache with a mismatched script context?"
                               );
    if (!bVar4) goto LAB_009a2dac;
    *puVar8 = 0;
  }
  uVar2 = (local_48->super_PropertyGuard).value;
  pDVar18 = (DynamicType *)(uVar2 & 0xfffffffffffffffe);
  if ((pDVar18 != (DynamicType *)0x0) && ((local_48->content).scriptContext.ptr == local_50)) {
    pRVar9 = (pDVar18->super_Type).prototype.ptr;
    pRVar10 = GetPrototypeObjectForConstructorCache((RecyclableObject *)this,local_50,local_b8);
    if (pRVar9 != pRVar10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1976,
                                  "(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached))"
                                  ,
                                  "type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached)"
                                 );
      if (!bVar4) goto LAB_009a2dac;
      *puVar8 = 0;
    }
    if (local_b8[0] == false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1977,"(cachedProtoCanBeCached)","cachedProtoCanBeCached");
      if (!bVar4) goto LAB_009a2dac;
      *puVar8 = 0;
    }
    if (pDVar18->isShared == false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1978,"(type->GetIsShared())","type->GetIsShared()");
      if (!bVar4) goto LAB_009a2dac;
      *puVar8 = 0;
    }
    TraceUseConstructorCache(local_48,this,true);
    pDVar11 = DynamicObject::New(local_50->recycler,pDVar18);
    bVar4 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar4) {
      pRVar9 = JavascriptProxy::AutoProxyWrapper(pDVar11);
      pDVar11 = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar9);
      return pDVar11;
    }
    return pDVar11;
  }
  if ((uVar2 == 1) && (((local_48->content).field_0x14 & 0x10) != 0)) {
    if ((local_48->content).updateAfterCtor == true) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x198b,"(!constructorCache->NeedsUpdateAfterCtor())",
                                  "!constructorCache->NeedsUpdateAfterCtor()");
      if (!bVar4) goto LAB_009a2dac;
      *puVar8 = 0;
    }
    TraceUseConstructorCache(local_48,this,true);
    if (!isBaseClassConstructorNewScObject) {
      return (Var)0x0;
    }
    pRVar9 = CreateFromConstructor(function,local_50);
    return pRVar9;
  }
  TraceUseConstructorCache(local_48,this,false);
  pSVar19 = local_50;
  local_40 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  if ((local_40->threadContext->disableImplicitFlags & DisableImplicitExceptionFlag) !=
      DisableImplicitNoFlag) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x199d,
                                "(!constructorScriptContext->GetThreadContext()->IsDisableImplicitException())"
                                ,
                                "!constructorScriptContext->GetThreadContext()->IsDisableImplicitException()"
                               );
    if (!bVar4) goto LAB_009a2dac;
    *puVar8 = 0;
  }
  ScriptContext::VerifyAlive(local_40,1,pSVar19);
  TVar1 = functionInfo->attributes;
  if ((TVar1 & ErrorOnNew) != None) {
    JavascriptError::ThrowTypeError(pSVar19,-0x7ff5ebf5,(PCWSTR)0x0);
  }
  this_00 = JavascriptFunction::GetFunctionProxy(this);
  if (this_00 == (FunctionProxy *)0x0) {
    this_02 = (FunctionBody *)0x0;
  }
  else {
    this_01 = FunctionProxy::EnsureDeserialized(this_00);
    this_02 = ParseableFunctionInfo::Parse(this_01,(ScriptFunction **)0x0,false);
  }
  objectScriptContext = local_40;
  if ((TVar1 & SkipDefaultNewObject) != None) {
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ConstructorCachePhase);
    pCVar13 = local_48;
    if (!bVar4) {
      if (this_02 != (FunctionBody *)0x0) {
        uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
        LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_02);
        bVar4 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ConstructorCachePhase,uVar7,LVar6);
        pCVar13 = local_48;
        if (bVar4) goto LAB_009a2d40;
      }
      pCVar13 = JavascriptFunction::EnsureValidConstructorCache(this);
      ConstructorCache::PopulateForSkipDefaultNewObject(pCVar13,local_40);
      if (this_02 == (FunctionBody *)0x0) {
        bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,ConstructorCachePhase);
        if (bVar4) {
          pcVar14 = L"(null)";
          pcVar16 = L"<unknown>";
          goto LAB_009a2d11;
        }
      }
      else {
        uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
        LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_02);
        bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,ConstructorCachePhase,uVar7,LVar6);
        if (bVar4) {
          iVar5 = (*(this_02->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(this_02);
          pcVar16 = (char16_t *)CONCAT44(extraout_var_00,iVar5);
          pcVar14 = FunctionProxy::GetDebugNumberSet
                              ((FunctionProxy *)this_02,(wchar (*) [42])local_b8);
LAB_009a2d11:
          Output::Print(L"CtorCache: populated cache (0x%p) for ctor %s (%s): ",pCVar13,pcVar16,
                        pcVar14);
          ConstructorCache::Dump(pCVar13);
          Output::Print(L"\n");
          Output::Flush();
        }
      }
    }
LAB_009a2d40:
    if ((pCVar13->content).updateAfterCtor == true) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x19c4,"(!constructorCache->NeedsUpdateAfterCtor())",
                                  "!constructorCache->NeedsUpdateAfterCtor()");
      if (!bVar4) {
LAB_009a2dac:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    return (Var)0x0;
  }
  pRVar9 = GetPrototypeObjectForConstructorCache(function,local_40,&local_32);
  aValue = CrossSite::MarshalVar(pSVar19,pRVar9,objectScriptContext);
  local_60 = VarTo<Js::RecyclableObject>(aValue);
  pDVar11 = JavascriptLibrary::CreateObject
                      ((pSVar19->super_ScriptContextBase).javascriptLibrary,local_60,8);
  bVar4 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar4) {
    pRVar9 = JavascriptProxy::AutoProxyWrapper(pDVar11);
    pDVar11 = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar9);
  }
  pDVar12 = DynamicObject::GetTypeHandler(pDVar11);
  iVar5 = (*pDVar12->_vptr_DynamicTypeHandler[6])(pDVar12);
  if (iVar5 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x19dc,"(newObject->GetTypeHandler()->GetPropertyCount() == 0)",
                                "newObject->GetTypeHandler()->GetPropertyCount() == 0");
    if (!bVar4) goto LAB_009a2dac;
    *puVar8 = 0;
  }
  local_31 = local_32;
  if (((local_40 == pSVar19) && (this_02 != (FunctionBody *)0x0)) && (local_32 != false)) {
    bVar4 = VarIsImpl<Js::JavascriptProxy>(&pDVar11->super_RecyclableObject);
    if ((!bVar4) &&
       (bVar4 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ConstructorCachePhase), !bVar4)) {
      local_54 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
      LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_02);
      pSVar19 = local_50;
      bVar4 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ConstructorCachePhase,local_54,LVar6);
      if (!bVar4) {
        pDVar18 = (DynamicType *)(pDVar11->super_RecyclableObject).type.ptr;
        if (pDVar18->isShared == false) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x19e4,"(newObjectType->GetIsShared())",
                                      "newObjectType->GetIsShared()");
          if (!bVar4) goto LAB_009a2dac;
          *puVar8 = 0;
        }
        pCVar13 = JavascriptFunction::EnsureValidConstructorCache(this);
        ConstructorCache::Populate
                  (pCVar13,pDVar18,local_40,
                   (bool)(((this_02->super_ParseableFunctionInfo).flags &
                          Flags_HasNoExplicitReturnValue) >> 6),true);
        bVar4 = ConstructorCache::IsConsistent(pCVar13);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x19ed,"(constructorCache->IsConsistent())",
                                      "constructorCache->IsConsistent()");
          if (!bVar4) goto LAB_009a2dac;
          *puVar8 = 0;
        }
        uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
        LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_02);
        bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,ConstructorCachePhase,uVar7,LVar6);
        if (!bVar4) {
          return pDVar11;
        }
        iVar5 = (*(this_02->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_02);
        pcVar14 = FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)this_02,(wchar (*) [42])local_b8);
        Output::Print(L"CtorCache: populated cache (0x%p) for ctor %s (%s): ",pCVar13,
                      CONCAT44(extraout_var,iVar5),pcVar14);
        ConstructorCache::Dump(pCVar13);
        goto LAB_009a2c95;
      }
    }
LAB_009a2bf3:
    uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
    LVar6 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_02);
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,ConstructorCachePhase,uVar7,LVar6);
    if (!bVar4) {
      return pDVar11;
    }
    iVar5 = (*(this_02->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_02);
    pcVar16 = (char16_t *)CONCAT44(extraout_var_01,iVar5);
    pcVar14 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this_02,(wchar (*) [42])local_b8);
    pcVar15 = L"of cross-context call";
    if (local_40 == pSVar19) {
      pcVar15 = L"constructor cache phase is off";
    }
  }
  else {
    if (this_02 != (FunctionBody *)0x0) goto LAB_009a2bf3;
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01453738,ConstructorCachePhase);
    if (!bVar4) {
      return pDVar11;
    }
    pcVar16 = L"<unknown>";
    pcVar14 = L"(null)";
    pcVar15 = L"function has no body";
  }
  pcVar17 = L"prototype cannot be cached";
  if (local_31 != '\0') {
    pcVar17 = pcVar15;
  }
  Output::Print(L"CtorCache: did not populate cache (0x%p) for ctor %s (%s), because %s: prototype = 0x%p, functionBody = 0x%p, ctor context = 0x%p, request context = 0x%p"
                ,local_48,pcVar16,pcVar14,pcVar17,local_60,this_02,local_40,pSVar19);
LAB_009a2c95:
  Output::Print(L"\n");
  Output::Flush();
  return pDVar11;
}

Assistant:

Var JavascriptOperators::NewScObjectCommon(RecyclableObject * function, FunctionInfo* functionInfo, ScriptContext * requestContext, bool isBaseClassConstructorNewScObject)
    {
        // CONSIDER: Allow for the cache to be repopulated if the type got collected, and a new one got populated with
        // the same number of inlined slots. This requires that the JIT-ed code actually load the type from the cache
        // (instead of hard-coding it), but it can (and must) keep the hard-coded number of inline slots.
        // CONSIDER: Consider also not pinning the type in the cache.  This can be done by using a registration based
        // weak reference (we need to control the memory address), which we don't yet have, or by allocating the cache from
        // the inline cache arena to allow it to be zeroed, but retain a recycler-allocated portion to hold on to the size of
        // inlined slots.

        JavascriptFunction* constructor = UnsafeVarTo<JavascriptFunction>(function);
        if (functionInfo->IsClassConstructor() && !isBaseClassConstructorNewScObject)
        {
            // If we are calling new on a class constructor, the contract is that we pass new.target as the 'this' argument.
            // function is the constructor on which we called new - which is new.target.
            // If we are trying to construct the object for a base class constructor as part of a super call, we should not
            // store new.target in the 'this' argument.
            return function;
        }
        ConstructorCache* constructorCache = constructor->GetConstructorCache();
        AssertMsg(constructorCache->GetScriptContext() == nullptr || constructorCache->GetScriptContext() == constructor->GetScriptContext(),
            "Why did we populate a constructor cache with a mismatched script context?");

        Assert(constructorCache != nullptr);
        DynamicType* type = constructorCache->GetGuardValueAsType();
        if (type != nullptr && constructorCache->GetScriptContext() == requestContext)
        {
#if DBG
            bool cachedProtoCanBeCached;
            Assert(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached));
            Assert(cachedProtoCanBeCached);
            Assert(type->GetIsShared());
#endif

#if DBG_DUMP
            TraceUseConstructorCache(constructorCache, constructor, true);
#endif
            Var object = DynamicObject::New(requestContext->GetRecycler(), type);
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
            }
#endif
            return object;
        }

        if (constructorCache->SkipDefaultNewObject())
        {
            Assert(!constructorCache->NeedsUpdateAfterCtor());

#if DBG_DUMP
            TraceUseConstructorCache(constructorCache, constructor, true);
#endif
            if (isBaseClassConstructorNewScObject)
            {
                return JavascriptOperators::CreateFromConstructor(function, requestContext);
            }

            return nullptr;
        }

#if DBG_DUMP
        TraceUseConstructorCache(constructorCache, constructor, false);
#endif

        ScriptContext* constructorScriptContext = function->GetScriptContext();
        Assert(!constructorScriptContext->GetThreadContext()->IsDisableImplicitException());
        // we shouldn't try to call the constructor if it's closed already.
        constructorScriptContext->VerifyAlive(TRUE, requestContext);

        FunctionInfo::Attributes attributes = functionInfo->GetAttributes();
        if (attributes & FunctionInfo::ErrorOnNew)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnNew);
        }

        // Slow path
        FunctionProxy * ctorProxy = constructor->GetFunctionProxy();
        FunctionBody * functionBody = ctorProxy != nullptr ? ctorProxy->EnsureDeserialized()->Parse() : nullptr;

        if (attributes & FunctionInfo::SkipDefaultNewObject)
        {
            // The constructor doesn't use the default new object.
#pragma prefast(suppress:6236, "DevDiv bug 830883. False positive when PHASE_OFF is #defined as '(false)'.")
            if (!PHASE_OFF1(ConstructorCachePhase) && (functionBody == nullptr || !PHASE_OFF(ConstructorCachePhase, functionBody)))
            {
                constructorCache = constructor->EnsureValidConstructorCache();
                constructorCache->PopulateForSkipDefaultNewObject(constructorScriptContext);

#if DBG_DUMP
                if ((functionBody != nullptr && PHASE_TRACE(Js::ConstructorCachePhase, functionBody)) || (functionBody == nullptr && PHASE_TRACE1(Js::ConstructorCachePhase)))
                {
                    const char16* ctorName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                    Output::Print(_u("CtorCache: populated cache (0x%p) for ctor %s (%s): "), constructorCache, ctorName,
                        functionBody ? functionBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
                    constructorCache->Dump();
                    Output::Print(_u("\n"));
                    Output::Flush();
                }
#endif

            }

            Assert(!constructorCache->NeedsUpdateAfterCtor());
            return nullptr;
        }

        // CONSIDER: Create some form of PatchGetProtoObjForCtorCache, which actually caches the prototype object in the constructor cache.
        // Make sure that it does NOT populate the guard field.  On the slow path (the only path for cross-context calls) we can do a faster lookup
        // after we fail the guard check.  When invalidating the cache for proto change, make sure we zap the prototype field of the cache in
        // addition to the guard value.
        bool prototypeCanBeCached;
        RecyclableObject* prototype = JavascriptOperators::GetPrototypeObjectForConstructorCache(
          function, constructorScriptContext, prototypeCanBeCached);
        prototype = VarTo<RecyclableObject>(CrossSite::MarshalVar(requestContext,
          prototype, constructorScriptContext));

        DynamicObject* newObject = requestContext->GetLibrary()->CreateObject(prototype, 8);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newObject));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
        }
#endif

        Assert(newObject->GetTypeHandler()->GetPropertyCount() == 0);

        if (prototypeCanBeCached && functionBody != nullptr && requestContext == constructorScriptContext &&
            !Js::VarIs<Js::JavascriptProxy>(newObject) &&
            !PHASE_OFF1(ConstructorCachePhase) && !PHASE_OFF(ConstructorCachePhase, functionBody))
        {
            DynamicType* newObjectType = newObject->GetDynamicType();
            // Initial type (without any properties) should always be shared up-front.  This allows us to populate the cache right away.
            Assert(newObjectType->GetIsShared());

            // Populate the cache here and set the updateAfterCtor flag.  This way, if the ctor is called recursively the
            // recursive calls will hit the cache and use the initial type.  On the unwind path, we will update the cache
            // after the innermost ctor and clear the flag.  After subsequent ctors we won't attempt an update anymore.
            // As long as the updateAfterCtor flag is set it is safe to update the cache, because it would not have been
            // hard-coded in the JIT-ed code.
            constructorCache = constructor->EnsureValidConstructorCache();
            constructorCache->Populate(newObjectType, constructorScriptContext, functionBody->GetHasNoExplicitReturnValue(), true);
            Assert(constructorCache->IsConsistent());

#if DBG_DUMP
            if ((functionBody != nullptr && PHASE_TRACE(Js::ConstructorCachePhase, functionBody)) || (functionBody == nullptr && PHASE_TRACE1(Js::ConstructorCachePhase)))
            {
                const char16* ctorName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(_u("CtorCache: populated cache (0x%p) for ctor %s (%s): "), constructorCache, ctorName,
                    functionBody ? functionBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
                constructorCache->Dump();
                Output::Print(_u("\n"));
                Output::Flush();
            }
#endif
        }
        else
        {
#if DBG_DUMP
            if ((functionBody != nullptr && PHASE_TRACE(Js::ConstructorCachePhase, functionBody)) || (functionBody == nullptr && PHASE_TRACE1(Js::ConstructorCachePhase)))
            {
                const char16* ctorName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(_u("CtorCache: did not populate cache (0x%p) for ctor %s (%s), because %s: prototype = 0x%p, functionBody = 0x%p, ctor context = 0x%p, request context = 0x%p"),
                    constructorCache, ctorName, functionBody ? functionBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"),
                    !prototypeCanBeCached ? _u("prototype cannot be cached") :
                    functionBody == nullptr ? _u("function has no body") :
                    requestContext != constructorScriptContext ? _u("of cross-context call") : _u("constructor cache phase is off"),
                    prototype, functionBody, constructorScriptContext, requestContext);
                Output::Print(_u("\n"));
                Output::Flush();
            }
#endif
        }

        return newObject;
    }